

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Packing_x86_avx2::forward_int8
          (Packing_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint _elempack;
  uint _h;
  _func_int **pp_Var2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Packing *this_00;
  long lVar23;
  int iVar24;
  int _c;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  Mat local_80;
  
  this_00 = (Packing *)
            ((long)&this->_vptr_Packing_x86_avx2 + (long)this->_vptr_Packing_x86_avx2[-3]);
  if (*(int *)(&this->field_0xd4 + (long)this->_vptr_Packing_x86_avx2[-3]) == 0) {
    uVar1 = bottom_blob->elempack;
    uVar20 = (ulong)uVar1;
    _elempack = this_00->out_elempack;
    if (uVar1 != _elempack) {
      uVar27 = bottom_blob->elemsize;
      bVar5 = _elempack != 1;
      bVar6 = uVar1 != 8;
      bVar7 = _elempack == 8;
      bVar8 = uVar1 == 1;
      if ((!bVar7 || !bVar8) && (bVar5 || bVar6)) goto LAB_00287c35;
      iVar16 = bottom_blob->dims;
      iVar28 = bottom_blob->w;
      _h = bottom_blob->h;
      if (iVar16 == 2) {
        uVar29 = (long)(int)(_h * uVar1) / (long)(int)_elempack;
        if ((int)(_h * uVar1) % (int)_elempack == 0) {
          iVar16 = (int)uVar29;
          Mat::create(top_blob,iVar28,iVar16,(ulong)_elempack * (uVar27 / uVar20),_elempack,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if (bVar7 && bVar8) {
              uVar20 = 0;
              iVar19 = 0;
              if (0 < iVar28) {
                iVar19 = iVar28;
              }
              uVar27 = uVar29 & 0xffffffff;
              if (iVar16 < 1) {
                uVar27 = uVar20;
              }
              lVar18 = 1;
              lVar30 = 2;
              local_d0 = 3;
              local_b8 = 4;
              local_c0 = 5;
              local_c8 = 6;
              local_b0 = 7;
              for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
                lVar25 = (long)bottom_blob->w;
                pvVar3 = bottom_blob->data;
                sVar17 = bottom_blob->elemsize;
                lVar23 = top_blob->elemsize * uVar29 * (long)top_blob->w;
                pvVar4 = top_blob->data;
                for (lVar26 = 0; iVar19 != (int)lVar26; lVar26 = lVar26 + 1) {
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * uVar20 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 1) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * lVar18 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 2) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * lVar30 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 3) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * local_d0 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 4) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * local_b8 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 5) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * local_c0 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 6) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * local_c8 * lVar25);
                  *(undefined1 *)((long)pvVar4 + lVar26 * 8 + lVar23 + 7) =
                       *(undefined1 *)((long)pvVar3 + lVar26 + sVar17 * local_b0 * lVar25);
                }
                uVar20 = uVar20 + 8;
                lVar18 = lVar18 + 8;
                lVar30 = lVar30 + 8;
                local_d0 = local_d0 + 8;
                local_b8 = local_b8 + 8;
                local_c0 = local_c0 + 8;
                local_c8 = local_c8 + 8;
                local_b0 = local_b0 + 8;
              }
            }
            if (bVar5 || bVar6) {
              return 0;
            }
            lVar18 = 1;
            lVar30 = 2;
            lVar23 = 3;
            local_d0 = 4;
            local_b8 = 5;
            local_c0 = 6;
            local_c8 = 7;
            if (iVar28 < 1) {
              iVar28 = 0;
            }
            uVar20 = (ulong)_h;
            if ((int)_h < 1) {
              uVar20 = 0;
            }
            lVar25 = 0;
            for (uVar27 = 0; uVar27 != uVar20; uVar27 = uVar27 + 1) {
              lVar21 = (long)top_blob->w;
              sVar17 = top_blob->elemsize;
              lVar26 = bottom_blob->elemsize * uVar27 * (long)bottom_blob->w;
              pvVar3 = top_blob->data;
              pvVar4 = bottom_blob->data;
              for (lVar22 = 0; iVar28 != (int)lVar22; lVar22 = lVar22 + 1) {
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * lVar25 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * lVar18 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 1);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * lVar30 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 2);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * lVar23 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 3);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * local_d0 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 4);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * local_b8 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 5);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * local_c0 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 6);
                *(undefined1 *)((long)pvVar3 + lVar22 + sVar17 * local_c8 * lVar21) =
                     *(undefined1 *)((long)pvVar4 + lVar22 * 8 + lVar26 + 7);
              }
              lVar25 = lVar25 + 8;
              lVar18 = lVar18 + 8;
              lVar30 = lVar30 + 8;
              lVar23 = lVar23 + 8;
              local_d0 = local_d0 + 8;
              local_b8 = local_b8 + 8;
              local_c0 = local_c0 + 8;
              local_c8 = local_c8 + 8;
            }
            return 0;
          }
          return -100;
        }
      }
      else {
        if (iVar16 == 1) {
          iVar28 = iVar28 * uVar1;
          Mat::operator=(top_blob,bottom_blob);
          if (iVar28 % (int)_elempack != 0) {
            return 0;
          }
          pp_Var2 = this->_vptr_Packing_x86_avx2;
          top_blob->w = iVar28 / *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
          top_blob->cstep = (long)(iVar28 / *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
          top_blob->elemsize =
               (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]) * (uVar27 / uVar20);
          top_blob->elempack = *(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
          return 0;
        }
        if (1 < iVar16 - 3U) {
          return 0;
        }
        iVar19 = bottom_blob->c;
        if ((int)(uVar1 * iVar19) % (int)_elempack == 0) {
          iVar24 = bottom_blob->d;
          _c = (int)(iVar19 * uVar1) / (int)_elempack;
          sVar17 = (uVar27 / uVar20) * (ulong)_elempack;
          if (iVar16 == 3) {
            Mat::create(top_blob,iVar28,_h,_c,sVar17,_elempack,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,iVar28,_h,iVar24,_c,sVar17,_elempack,opt->blob_allocator);
          }
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          iVar24 = _h * iVar28 * iVar24;
          if (bVar7 && bVar8) {
            iVar28 = 0;
            iVar16 = 0;
            if (0 < iVar24) {
              iVar16 = iVar24;
            }
            if (_c < 1) {
              _c = 0;
            }
            for (; iVar28 != _c; iVar28 = iVar28 + 1) {
              Mat::channel(&local_80,bottom_blob,iVar28 * 8);
              pvVar3 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 1);
              pvVar4 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 2);
              pvVar9 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 3);
              pvVar10 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 4);
              pvVar11 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 5);
              pvVar12 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 6);
              pvVar13 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,bottom_blob,iVar28 * 8 + 7);
              pvVar14 = local_80.data;
              Mat::~Mat(&local_80);
              Mat::channel(&local_80,top_blob,iVar28);
              pvVar15 = local_80.data;
              Mat::~Mat(&local_80);
              for (lVar18 = 0; iVar16 != (int)lVar18; lVar18 = lVar18 + 1) {
                *(undefined1 *)((long)pvVar15 + lVar18 * 8) = *(undefined1 *)((long)pvVar3 + lVar18)
                ;
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 1) =
                     *(undefined1 *)((long)pvVar4 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 2) =
                     *(undefined1 *)((long)pvVar9 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 3) =
                     *(undefined1 *)((long)pvVar10 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 4) =
                     *(undefined1 *)((long)pvVar11 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 5) =
                     *(undefined1 *)((long)pvVar12 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 6) =
                     *(undefined1 *)((long)pvVar13 + lVar18);
                *(undefined1 *)((long)pvVar15 + lVar18 * 8 + 7) =
                     *(undefined1 *)((long)pvVar14 + lVar18);
              }
            }
          }
          if (bVar5 || bVar6) {
            return 0;
          }
          if (iVar24 < 1) {
            iVar24 = 0;
          }
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          for (iVar16 = 0; iVar16 != iVar19; iVar16 = iVar16 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar16);
            pvVar3 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8);
            pvVar4 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 1);
            pvVar9 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 2);
            pvVar10 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 3);
            pvVar11 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 4);
            pvVar12 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 5);
            pvVar13 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 6);
            pvVar14 = local_80.data;
            Mat::~Mat(&local_80);
            Mat::channel(&local_80,top_blob,iVar16 * 8 + 7);
            pvVar15 = local_80.data;
            Mat::~Mat(&local_80);
            for (lVar18 = 0; iVar24 != (int)lVar18; lVar18 = lVar18 + 1) {
              *(undefined1 *)((long)pvVar4 + lVar18) = *(undefined1 *)((long)pvVar3 + lVar18 * 8);
              *(undefined1 *)((long)pvVar9 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 1);
              *(undefined1 *)((long)pvVar10 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 2);
              *(undefined1 *)((long)pvVar11 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 3);
              *(undefined1 *)((long)pvVar12 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 4);
              *(undefined1 *)((long)pvVar13 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 5);
              *(undefined1 *)((long)pvVar14 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 6);
              *(undefined1 *)((long)pvVar15 + lVar18) =
                   *(undefined1 *)((long)pvVar3 + lVar18 * 8 + 7);
            }
          }
          return 0;
        }
      }
    }
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
LAB_00287c35:
  iVar16 = Packing::forward(this_00,bottom_blob,top_blob,opt);
  return iVar16;
}

Assistant:

int Packing_x86_avx2::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}